

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *__stream;
  urlq_handle_t p_Var1;
  byte bVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  undefined8 extraout_RAX;
  long lVar7;
  char url [8192];
  urlq_getopt_t local_2068;
  char local_2038 [8200];
  
  coda_url::coda_url(&local_2068.parent);
  local_2068.parent.dom_len = 0;
  local_2068.parent._28_4_ = 0;
  local_2068.handle = (urlq_handle_t)0x0;
  local_2068.parent.val_len = 0;
  local_2068.parent._12_4_ = 0;
  local_2068.parent.dom_str = (char *)0x0;
  local_2068._0_8_ = 0;
  local_2068.parent.val_str = (char *)0x0;
  iVar3 = urlq_getopt_parse(argc,argv,&local_2068);
  if (iVar3 != 0) {
    main_cold_1();
LAB_001037cc:
    main_cold_2();
    coda_url::~coda_url(&local_2068.parent);
    _Unwind_Resume(extraout_RAX);
  }
  bVar2 = local_2068._0_1_ & 7;
  if (bVar2 == 1) {
    local_2068.handle = urlq_uparse;
  }
  else if (bVar2 == 3) {
    local_2068.handle = urlq_decode;
  }
  else {
    if (bVar2 != 4) goto LAB_001037cc;
    local_2068.handle = urlq_encode;
  }
  lVar4 = (long)_optind;
  if (_optind < argc) {
    iVar3 = argc - _optind;
    lVar7 = 0;
    do {
      p_Var1 = local_2068.handle;
      pcVar6 = argv[lVar4 + lVar7];
      sVar5 = strlen(pcVar6);
      (*p_Var1)(pcVar6,sVar5,&local_2068);
      lVar7 = lVar7 + 1;
    } while (iVar3 != (int)lVar7);
  }
  if (argc <= _optind) {
    do {
      iVar3 = feof(_stdin);
      __stream = _stdin;
      if (((iVar3 != 0) || (iVar3 = ferror(_stdin), iVar3 != 0)) ||
         (pcVar6 = fgets(local_2038,0x2000,__stream), pcVar6 == (char *)0x0)) break;
      sVar5 = strcspn(local_2038,"\r\n");
      local_2038[sVar5] = '\0';
      (*local_2068.handle)(local_2038,sVar5,&local_2068);
    } while (pcVar6 != (char *)0x0);
  }
  coda_url::~coda_url(&local_2068.parent);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    int i;

    urlq_getopt_t opts;
    std::memset(static_cast<void*>(&opts), 0, sizeof(opts));

    if (0 != urlq_getopt_parse(argc, argv, &opts))
    {
        urlq_getopt_usage(argc, argv);
        exit(EXIT_FAILURE);
    }

    if (0 != urlq_load(&opts))
    {
        urlq_getopt_usage(argc, argv);
        exit(EXIT_FAILURE);
    }

    for (i = optind; i < argc; ++i)
    {
        opts.handle(argv[i], strlen(argv[i]), &opts);
    }

    if (optind < argc)
    {
        return 0;
    }

    while (!feof(stdin) && !ferror(stdin))
    {
        char url [URLBUF];
        size_t sz;

        if (NULL == fgets(url, URLBUF, stdin))
        {
            break;
        }

        sz = strcspn(url, "\r\n");  /* optional */
        url[sz] = 0;                /* optional */

        opts.handle(url, sz, &opts);
    }

    return 0;
}